

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O2

vec2 dja::normalize(vec2 *a)

{
  vec2 vVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  fVar3 = (*a).x;
  fVar4 = (*a).y;
  fVar2 = 1.0 / SQRT(fVar3 * fVar3 + fVar4 * fVar4);
  vVar1.y = fVar2 * fVar4;
  vVar1.x = fVar2 * fVar3;
  return vVar1;
}

Assistant:

V2 normalize(const V2& a) {return a / norm(a);}